

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<kj::HttpClient::WebSocketResponse> __thiscall
kj::anon_unknown_36::ConcurrencyLimitingHttpClient::openWebSocket
          (ConcurrencyLimitingHttpClient *this,StringPtr url,HttpHeaders *headers)

{
  SourceLocation location;
  char *pcVar1;
  size_t sVar2;
  PromiseArena *pPVar3;
  OwnPromiseNode node;
  HttpHeaderTable *node_00;
  void *pvVar4;
  int __flags;
  HttpHeaders *pHVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  ConcurrencyLimitingHttpClient *this_00;
  PromiseArena *pPVar6;
  __fn *in_R8;
  __fn *__arg;
  PromiseNode *ptrCopy;
  undefined1 *size;
  TransformPromiseNodeBase *this_01;
  PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  paf;
  String urlCopy;
  ConnectionCounter counter;
  HttpHeaders headersCopy;
  undefined8 in_stack_fffffffffffffe88;
  PromiseBase in_stack_fffffffffffffe90;
  PromiseBase node_01;
  Disposer *in_stack_fffffffffffffe98;
  PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  *local_160;
  String local_158;
  ConnectionCounter local_138;
  PromiseArena *local_130;
  PromiseArena *pPStack_128;
  PromiseArena *pPStack_120;
  HttpHeaders local_118;
  OwnPromiseNode local_b8;
  HttpHeaders local_b0;
  _func_int **local_50;
  SourceLocation local_48;
  
  this_00 = (ConcurrencyLimitingHttpClient *)url.content.ptr;
  local_138.parent = this_00;
  if (this_00->concurrentRequests < this_00->maxConcurrentRequests) {
    this_00->concurrentRequests = this_00->concurrentRequests + 1;
    (*this_00->inner->_vptr_HttpClient[1])
              (&local_b0,this_00->inner,(void *)url.content.size_,headers);
    fireCountChanged(this_00);
    attachCounter(this,(Promise<kj::HttpClient::WebSocketResponse> *)&local_b0,&local_138);
    node_00 = local_b0.table;
    if (local_b0.table != (HttpHeaderTable *)0x0) {
      local_b0.table = (HttpHeaderTable *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_00);
    }
    ConnectionCounter::~ConnectionCounter(&local_138);
  }
  else {
    location.function = (char *)in_stack_fffffffffffffe90.node.ptr;
    location.fileName = (char *)in_stack_fffffffffffffe88;
    location._16_8_ = in_stack_fffffffffffffe98;
    pHVar5 = headers;
    __arg = in_R8;
    newPromiseAndFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
              ((PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                *)&stack0xfffffffffffffe90,location);
    __flags = (int)pHVar5;
    size = (undefined1 *)((long)&headers[-1].ownedStrings.builder.disposer + 7);
    heapString(&local_158,(size_t)size);
    pvVar4 = extraout_RDX;
    if (size != (undefined1 *)0x0) {
      pPVar6 = (PromiseArena *)local_158.content.size_;
      if ((PromiseArena *)local_158.content.size_ != (PromiseArena *)0x0) {
        pPVar6 = (PromiseArena *)local_158.content.ptr;
      }
      memcpy(pPVar6,(void *)url.content.size_,(size_t)size);
      pvVar4 = extraout_RDX_00;
    }
    HttpHeaders::clone(&local_b0,in_R8,pvVar4,__flags,__arg);
    local_130 = (PromiseArena *)local_158.content.ptr;
    pPStack_128 = (PromiseArena *)local_158.content.size_;
    pPStack_120 = (PromiseArena *)local_158.content.disposer;
    local_158.content.ptr = (char *)0x0;
    local_158.content.size_ = 0;
    local_118.table = local_b0.table;
    local_118.indexedHeaders.ptr = local_b0.indexedHeaders.ptr;
    local_118.indexedHeaders.size_ = local_b0.indexedHeaders.size_;
    local_118.indexedHeaders.disposer = local_b0.indexedHeaders.disposer;
    local_118.unindexedHeaders.builder.ptr = local_b0.unindexedHeaders.builder.ptr;
    local_b0.indexedHeaders.ptr = (StringPtr *)0x0;
    local_b0.indexedHeaders.size_ = 0;
    local_118.unindexedHeaders.builder.pos = local_b0.unindexedHeaders.builder.pos;
    local_118.unindexedHeaders.builder.endPtr = local_b0.unindexedHeaders.builder.endPtr;
    local_118.unindexedHeaders.builder.disposer = local_b0.unindexedHeaders.builder.disposer;
    local_b0.unindexedHeaders.builder.ptr = (Header *)0x0;
    local_b0.unindexedHeaders.builder.pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
    local_b0.unindexedHeaders.builder.endPtr = (Header *)0x0;
    local_118.ownedStrings.builder.ptr = local_b0.ownedStrings.builder.ptr;
    local_118.ownedStrings.builder.pos = local_b0.ownedStrings.builder.pos;
    local_118.ownedStrings.builder.endPtr = local_b0.ownedStrings.builder.endPtr;
    local_118.ownedStrings.builder.disposer = local_b0.ownedStrings.builder.disposer;
    local_b0.ownedStrings.builder.ptr = (Array<char> *)0x0;
    local_b0.ownedStrings.builder.pos = (RemoveConst<kj::Array<char>_> *)0x0;
    local_b0.ownedStrings.builder.endPtr = (Array<char> *)0x0;
    pPVar6 = (((PromiseNode *)in_stack_fffffffffffffe90.node.ptr)->super_PromiseArenaMember).arena;
    if (pPVar6 == (PromiseArena *)0x0 ||
        (ulong)((long)in_stack_fffffffffffffe90.node.ptr - (long)pPVar6) < 0xa0) {
      pvVar4 = operator_new(0x400);
      this_01 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x360);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_01,(OwnPromiseNode *)&stack0xfffffffffffffe90,
                 kj::_::
                 SimpleTransformPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6537:15)>
                 ::anon_class_128_3_d8bda789_for_func::operator());
      *(undefined ***)((long)pvVar4 + 0x360) = &PTR_destroy_00704f38;
      *(ConcurrencyLimitingHttpClient **)((long)pvVar4 + 0x380) = local_138.parent;
      *(PromiseArena **)((long)pvVar4 + 0x388) = local_130;
      *(PromiseArena **)((long)pvVar4 + 0x390) = pPStack_128;
      *(PromiseArena **)((long)pvVar4 + 0x398) = pPStack_120;
      *(HttpHeaderTable **)((long)pvVar4 + 0x3a0) = local_118.table;
      *(StringPtr **)((long)pvVar4 + 0x3a8) = local_118.indexedHeaders.ptr;
      *(size_t *)((long)pvVar4 + 0x3b0) = local_118.indexedHeaders.size_;
      *(ArrayDisposer **)((long)pvVar4 + 0x3b8) = local_118.indexedHeaders.disposer;
      *(Header **)((long)pvVar4 + 0x3c0) = local_118.unindexedHeaders.builder.ptr;
      *(RemoveConst<kj::HttpHeaders::Header> **)((long)pvVar4 + 0x3c8) =
           local_118.unindexedHeaders.builder.pos;
      *(Header **)((long)pvVar4 + 0x3d0) = local_118.unindexedHeaders.builder.endPtr;
      *(ArrayDisposer **)((long)pvVar4 + 0x3d8) = local_118.unindexedHeaders.builder.disposer;
      *(Array<char> **)((long)pvVar4 + 0x3e0) = local_118.ownedStrings.builder.ptr;
      *(RemoveConst<kj::Array<char>_> **)((long)pvVar4 + 1000) = local_118.ownedStrings.builder.pos;
      *(Array<char> **)((long)pvVar4 + 0x3f0) = local_118.ownedStrings.builder.endPtr;
      *(ArrayDisposer **)((long)pvVar4 + 0x3f8) = local_118.ownedStrings.builder.disposer;
      *(void **)((long)pvVar4 + 0x368) = pvVar4;
      node_01.node.ptr = in_stack_fffffffffffffe90.node.ptr;
    }
    else {
      (((PromiseNode *)in_stack_fffffffffffffe90.node.ptr)->super_PromiseArenaMember).arena =
           (PromiseArena *)0x0;
      this_01 = (TransformPromiseNodeBase *)((long)in_stack_fffffffffffffe90.node.ptr + -0xa0);
      node_01.node.ptr = in_stack_fffffffffffffe90.node.ptr;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_01,(OwnPromiseNode *)&stack0xfffffffffffffe90,
                 kj::_::
                 SimpleTransformPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6537:15)>
                 ::anon_class_128_3_d8bda789_for_func::operator());
      ((PromiseArenaMember *)((long)in_stack_fffffffffffffe90.node.ptr + -0xa0))->
      _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_00704f38;
      ((PromiseArenaMember *)((long)in_stack_fffffffffffffe90.node.ptr + -0x80))->
      _vptr_PromiseArenaMember = (_func_int **)local_138.parent;
      ((PromiseArenaMember *)((long)in_stack_fffffffffffffe90.node.ptr + -0x80))->arena = local_130;
      ((PromiseArenaMember *)((long)in_stack_fffffffffffffe90.node.ptr + -0x70))->
      _vptr_PromiseArenaMember = (_func_int **)pPStack_128;
      ((PromiseArenaMember *)((long)in_stack_fffffffffffffe90.node.ptr + -0x70))->arena =
           pPStack_120;
      ((PromiseArenaMember *)((long)in_stack_fffffffffffffe90.node.ptr + -0x60))->
      _vptr_PromiseArenaMember = (_func_int **)local_118.table;
      ((PromiseArenaMember *)((long)in_stack_fffffffffffffe90.node.ptr + -0x60))->arena =
           (PromiseArena *)local_118.indexedHeaders.ptr;
      ((PromiseArenaMember *)((long)in_stack_fffffffffffffe90.node.ptr + -0x50))->
      _vptr_PromiseArenaMember = (_func_int **)local_118.indexedHeaders.size_;
      ((PromiseArenaMember *)((long)in_stack_fffffffffffffe90.node.ptr + -0x50))->arena =
           (PromiseArena *)local_118.indexedHeaders.disposer;
      ((PromiseArenaMember *)((long)in_stack_fffffffffffffe90.node.ptr + -0x40))->
      _vptr_PromiseArenaMember = (_func_int **)local_118.unindexedHeaders.builder.ptr;
      ((PromiseArenaMember *)((long)in_stack_fffffffffffffe90.node.ptr + -0x40))->arena =
           (PromiseArena *)local_118.unindexedHeaders.builder.pos;
      ((PromiseArenaMember *)((long)in_stack_fffffffffffffe90.node.ptr + -0x30))->
      _vptr_PromiseArenaMember = (_func_int **)local_118.unindexedHeaders.builder.endPtr;
      ((PromiseArenaMember *)((long)in_stack_fffffffffffffe90.node.ptr + -0x30))->arena =
           (PromiseArena *)local_118.unindexedHeaders.builder.disposer;
      ((PromiseArenaMember *)((long)in_stack_fffffffffffffe90.node.ptr + -0x20))->
      _vptr_PromiseArenaMember = (_func_int **)local_118.ownedStrings.builder.ptr;
      ((PromiseArenaMember *)((long)in_stack_fffffffffffffe90.node.ptr + -0x20))->arena =
           (PromiseArena *)local_118.ownedStrings.builder.pos;
      ((PromiseArenaMember *)((long)in_stack_fffffffffffffe90.node.ptr + -0x10))->
      _vptr_PromiseArenaMember = (_func_int **)local_118.ownedStrings.builder.endPtr;
      ((PromiseArenaMember *)((long)in_stack_fffffffffffffe90.node.ptr + -0x10))->arena =
           (PromiseArena *)local_118.ownedStrings.builder.disposer;
      ((PromiseArenaMember *)((long)in_stack_fffffffffffffe90.node.ptr + -0xa0))->arena = pPVar6;
    }
    local_118.ownedStrings.builder.endPtr = (Array<char> *)0x0;
    local_118.ownedStrings.builder.pos = (RemoveConst<kj::Array<char>_> *)0x0;
    local_118.ownedStrings.builder.ptr = (Array<char> *)0x0;
    local_118.unindexedHeaders.builder.endPtr = (Header *)0x0;
    local_118.unindexedHeaders.builder.pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
    local_118.unindexedHeaders.builder.ptr = (Header *)0x0;
    local_118.indexedHeaders.size_ = 0;
    local_118.indexedHeaders.ptr = (StringPtr *)0x0;
    pPStack_128 = (PromiseArena *)0x0;
    local_130 = (PromiseArena *)0x0;
    local_48.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
    ;
    local_48.function = "then";
    local_48.lineNumber = 0x58b;
    local_48.columnNumber = 0x4c;
    local_b8.ptr = &this_01->super_PromiseNode;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_50,&local_b8,&local_48);
    node.ptr = local_b8.ptr;
    if ((TransformPromiseNodeBase *)local_b8.ptr != (TransformPromiseNodeBase *)0x0) {
      local_b8.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
    }
    HttpHeaders::~HttpHeaders(&local_118);
    pPVar3 = pPStack_128;
    pPVar6 = local_130;
    if (local_130 != (PromiseArena *)0x0) {
      local_130 = (PromiseArena *)0x0;
      pPStack_128 = (PromiseArena *)0x0;
      (*(code *)**(undefined8 **)pPStack_120->bytes)(pPStack_120,pPVar6,1,pPVar3,pPVar3,0);
    }
    std::
    queue<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::deque<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>_>
    ::push(&this_00->pendingRequests,(value_type *)&stack0xfffffffffffffe98);
    fireCountChanged(this_00);
    (this->super_HttpClient)._vptr_HttpClient = local_50;
    HttpHeaders::~HttpHeaders(&local_b0);
    sVar2 = local_158.content.size_;
    pcVar1 = local_158.content.ptr;
    if (local_158.content.ptr != (char *)0x0) {
      local_158.content.ptr = (char *)0x0;
      local_158.content.size_ = 0;
      (**(local_158.content.disposer)->_vptr_ArrayDisposer)
                (local_158.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
    if (local_160 !=
        (PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
         *)0x0) {
      (**in_stack_fffffffffffffe98->_vptr_Disposer)
                (in_stack_fffffffffffffe98,
                 (local_160->super_PromiseRejector)._vptr_PromiseRejector[-2] +
                 (long)&(local_160->super_PromiseRejector)._vptr_PromiseRejector);
    }
    if (node_01.node.ptr != (PromiseNode *)0x0) {
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_01.node.ptr);
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<WebSocketResponse> openWebSocket(
      kj::StringPtr url, const kj::HttpHeaders& headers) override {
    if (concurrentRequests < maxConcurrentRequests) {
      auto counter = ConnectionCounter(*this);
      auto response = inner.openWebSocket(url, headers);
      fireCountChanged();
      return attachCounter(kj::mv(response), kj::mv(counter));
    }

    auto paf = kj::newPromiseAndFulfiller<ConnectionCounter>();
    auto urlCopy = kj::str(url);
    auto headersCopy = headers.clone();

    auto promise = paf.promise
        .then([this,
               urlCopy = kj::mv(urlCopy),
               headersCopy = kj::mv(headersCopy)](ConnectionCounter&& counter) mutable {
      return attachCounter(inner.openWebSocket(urlCopy, headersCopy), kj::mv(counter));
    });

    pendingRequests.push(kj::mv(paf.fulfiller));
    fireCountChanged();
    return kj::mv(promise);
  }